

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.h
# Opt level: O0

void __thiscall Word::~Word(Word *this)

{
  Word *this_local;
  
  ~Word(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Word(){

    }